

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::dropToLog(TranslateToFuzzReader *this,Function *func)

{
  bool bVar1;
  undefined1 local_100 [8];
  Modder modder;
  Function *func_local;
  TranslateToFuzzReader *this_local;
  
  modder.parent = (TranslateToFuzzReader *)func;
  bVar1 = oneIn(this,2);
  if (!bVar1) {
    dropToLog(wasm::Function*)::Modder::Modder(wasm::Module&,wasm::TranslateToFuzzReader__
              ((Walker<Modder,_wasm::Visitor<Modder,_void>_> *)local_100,this->wasm,this);
    Walker<Modder,_wasm::Visitor<Modder,_void>_>::walk
              ((Walker<Modder,_wasm::Visitor<Modder,_void>_> *)local_100,
               (Expression **)&(modder.parent)->funcrefTableName);
    dropToLog::Modder::~Modder((Modder *)local_100);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::dropToLog(Function* func) {
  // Don't always do this.
  if (oneIn(2)) {
    return;
  }
  struct Modder : public PostWalker<Modder> {
    Module& wasm;
    TranslateToFuzzReader& parent;

    Modder(Module& wasm, TranslateToFuzzReader& parent)
      : wasm(wasm), parent(parent) {}

    void visitDrop(Drop* curr) {
      if (parent.isLoggableType(curr->value->type) && parent.oneIn(2)) {
        auto target = parent.logImportNames[curr->value->type];
        replaceCurrent(
          parent.builder.makeCall(target, {curr->value}, Type::none));
      }
    }
  };
  Modder modder(wasm, *this);
  modder.walk(func->body);
}